

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O3

void cfd::api::json::TransactionJsonApi::DecodeRawTransaction
               (DecodeRawTransactionRequest *request,DecodeRawTransactionResponse *response)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  Script *object;
  pointer pAVar3;
  ByteData *pBVar4;
  bool bVar5;
  NetType type;
  uint32_t uVar6;
  CfdException *pCVar7;
  _func_int **pp_Var8;
  pointer pTVar9;
  undefined1 this [8];
  pointer object_00;
  int64_t require_num;
  string script_type;
  DecodeRawTransactionTxIn res_txin;
  DecodeRawTransactionTxOut res_txout;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list;
  DecodeLockingScript script_pub_key_res;
  Transaction tx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addresses;
  Script locking_script;
  AddressFactory addr_factory;
  int64_t local_4c8;
  string local_4c0;
  pointer local_4a0;
  undefined1 local_498 [8];
  WitnessVersion local_490 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  char local_478 [16];
  pointer local_468;
  string local_460 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  string local_440 [8];
  pointer local_438;
  undefined1 local_420 [96];
  string local_3c0 [24];
  undefined1 local_3a8 [16];
  pointer local_398;
  Script local_390;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  undefined1 local_320 [8];
  undefined1 local_318 [48];
  int64_t local_2e8;
  uint32_t local_2e0;
  DecodeLockingScript local_2d8;
  string local_218;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> local_1f8;
  undefined1 local_1e0 [8];
  ByteData *local_1d8;
  ByteData local_1d0;
  string local_1a8 [32];
  string local_188 [32];
  int local_168;
  string local_160 [40];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_138 [24];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_120;
  Transaction local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  Script local_90;
  AddressFactory local_58;
  
  if (request == (DecodeRawTransactionRequest *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_498 = (undefined1  [8])&local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"request is null.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_498);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (response == (DecodeRawTransactionResponse *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_498 = (undefined1  [8])&local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"response is null.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_498);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  pcVar2 = (request->hex_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar2,pcVar2 + (request->hex_)._M_string_length);
  if (local_218._M_string_length == 0) {
    local_498 = (undefined1  [8])0x5e711d;
    local_490[0] = 0x4b;
    local_488._M_allocated_capacity = (long)"ElementsDecodeRawTransaction" + 8;
    core::logger::log<>((CfdSourceLocation *)local_498,kCfdLogLevelWarning,
                        "Failed to DecodeRawTransactionRequest. hex empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_498 = (undefined1  [8])&local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"Invalid hex string. empty data.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_498);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_498 = (undefined1  [8])&local_488;
  pcVar2 = (request->network_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_498,pcVar2,pcVar2 + (request->network_)._M_string_length);
  type = ConvertNetType((string *)local_498);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498);
  }
  core::Transaction::Transaction(&local_108,&local_218);
  core::AbstractTransaction::GetTxid((Txid *)local_320,&local_108.super_AbstractTransaction);
  core::Txid::GetHex_abi_cxx11_((string *)local_498,(Txid *)local_320);
  std::__cxx11::string::_M_assign((string *)&response->txid_);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498);
  }
  local_320 = (undefined1  [8])&PTR__Txid_00723450;
  if ((pointer)local_318._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_318._0_8_);
  }
  core::AbstractTransaction::GetWitnessHash
            ((ByteData256 *)local_1e0,&local_108.super_AbstractTransaction);
  core::Txid::Txid((Txid *)local_320,(ByteData256 *)local_1e0);
  core::Txid::GetHex_abi_cxx11_((string *)local_498,(Txid *)local_320);
  std::__cxx11::string::_M_assign((string *)&response->hash_);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498);
  }
  local_320 = (undefined1  [8])&PTR__Txid_00723450;
  if ((pointer)local_318._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_1e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e0);
  }
  uVar6 = core::Transaction::GetTotalSize(&local_108);
  response->size_ = uVar6;
  uVar6 = core::Transaction::GetVsize(&local_108);
  response->vsize_ = uVar6;
  uVar6 = core::Transaction::GetWeight(&local_108);
  response->weight_ = uVar6;
  uVar6 = core::AbstractTransaction::GetVersion(&local_108.super_AbstractTransaction);
  response->version_ = uVar6;
  uVar6 = core::AbstractTransaction::GetLockTime(&local_108.super_AbstractTransaction);
  response->locktime_ = uVar6;
  core::Transaction::GetTxInList
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_90,&local_108);
  if (local_90._vptr_Script !=
      (_func_int **)
      local_90.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pp_Var1 = (_func_int **)(local_318 + 8);
    pp_Var8 = local_90._vptr_Script;
    do {
      DecodeRawTransactionTxIn::DecodeRawTransactionTxIn((DecodeRawTransactionTxIn *)local_498);
      bVar5 = core::AbstractTransaction::IsCoinBase(&local_108.super_AbstractTransaction);
      local_320 = (undefined1  [8])pp_Var1;
      if (bVar5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"txid","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        local_320 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"vout","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        local_320 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"scriptSig","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        local_320 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"txinwitness","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        core::Script::Script((Script *)local_320,(Script *)(pp_Var8 + 6));
        bVar5 = core::Script::IsEmpty((Script *)local_320);
        core::Script::~Script((Script *)local_320);
        if (!bVar5) {
          core::Script::Script((Script *)local_320,(Script *)(pp_Var8 + 6));
          core::Script::GetHex_abi_cxx11_((string *)local_1e0,(Script *)local_320);
          std::__cxx11::string::_M_assign(local_460);
          if (local_1e0 != (undefined1  [8])&local_1d0) {
            operator_delete((void *)local_1e0);
          }
          core::Script::~Script((Script *)local_320);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"coinbase","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        core::Txid::Txid((Txid *)local_1e0,(Txid *)(pp_Var8 + 1));
        core::Txid::GetHex_abi_cxx11_((string *)local_320,(Txid *)local_1e0);
        std::__cxx11::string::_M_assign(local_440);
        if (local_320 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_320);
        }
        local_1e0 = (undefined1  [8])&PTR__Txid_00723450;
        if (local_1d8 != (ByteData *)0x0) {
          operator_delete(local_1d8);
        }
        local_420._0_4_ = *(undefined4 *)(pp_Var8 + 5);
        object = (Script *)(pp_Var8 + 6);
        core::Script::Script((Script *)local_320,object);
        bVar5 = core::Script::IsEmpty((Script *)local_320);
        core::Script::~Script((Script *)local_320);
        if (!bVar5) {
          core::Script::Script((Script *)local_320,object);
          core::Script::ToString_abi_cxx11_((string *)local_1e0,(Script *)local_320);
          std::__cxx11::string::_M_assign((string *)(local_420 + 0x40));
          if (local_1e0 != (undefined1  [8])&local_1d0) {
            operator_delete((void *)local_1e0);
          }
          core::Script::~Script((Script *)local_320);
          core::Script::Script((Script *)local_320,object);
          core::Script::GetHex_abi_cxx11_((string *)local_1e0,(Script *)local_320);
          std::__cxx11::string::_M_assign(local_3c0);
          if (local_1e0 != (undefined1  [8])&local_1d0) {
            operator_delete((void *)local_1e0);
          }
          core::Script::~Script((Script *)local_320);
        }
        local_320 = (undefined1  [8])&PTR__ScriptWitness_00723678;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_318,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   (pp_Var8 + 0xf));
        core::ScriptWitness::GetWitness
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_1e0,
                   (ScriptWitness *)local_320);
        local_320 = (undefined1  [8])&PTR__ScriptWitness_00723678;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_318);
        pBVar4 = local_1d8;
        for (this = local_1e0; this != (undefined1  [8])pBVar4;
            this = (undefined1  [8])((long)this + 0x18)) {
          core::ByteData::GetHex_abi_cxx11_((string *)local_320,(ByteData *)this);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320
                    );
          if (local_320 != (undefined1  [8])pp_Var1) {
            operator_delete((void *)local_320);
          }
        }
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_1e0);
        if (local_398 == (pointer)local_390._vptr_Script) {
          local_320 = (undefined1  [8])pp_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"txinwitness","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_490,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320)
          ;
          if (local_320 != (undefined1  [8])pp_Var1) {
            operator_delete((void *)local_320);
          }
        }
      }
      local_390.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = *(uint32_t *)(pp_Var8 + 0xd);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
      ::push_back(&(response->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
                   super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                  ,(DecodeRawTransactionTxIn *)local_498);
      DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn((DecodeRawTransactionTxIn *)local_498);
      pp_Var8 = pp_Var8 + 0x12;
    } while (pp_Var8 !=
             (_func_int **)
             local_90.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_90);
  core::Transaction::GetTxOutList(&local_120,&local_108);
  local_4a0 = local_120.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_120.
      super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_120.
      super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pTVar9 = local_120.
             super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      DecodeRawTransactionTxOut::DecodeRawTransactionTxOut((DecodeRawTransactionTxOut *)local_320);
      local_498 = (undefined1  [8])(pTVar9->super_AbstractTxOutReference).value_.amount_;
      local_490[0] = CONCAT31(local_490[0]._1_3_,
                              (pTVar9->super_AbstractTxOutReference).value_.ignore_check_);
      local_2e8 = core::Amount::GetSatoshiValue((Amount *)local_498);
      local_2e0 = uVar6;
      DecodeLockingScript::DecodeLockingScript((DecodeLockingScript *)local_1e0);
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      core::Script::Script(&local_90,&(pTVar9->super_AbstractTxOutReference).locking_script_);
      core::Script::GetHex_abi_cxx11_((string *)local_498,&local_90);
      std::__cxx11::string::_M_assign(local_188);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498);
      }
      core::Script::ToString_abi_cxx11_((string *)local_498,&local_90);
      std::__cxx11::string::_M_assign(local_1a8);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498);
      }
      AddressFactory::AddressFactory(&local_58,type);
      local_4c8 = 0;
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      local_4c0._M_string_length = 0;
      local_4c0.field_2._M_local_buf[0] = '\0';
      ConvertFromLockingScript(&local_1f8,&local_58,&local_90,&local_4c0,&local_4c8);
      std::__cxx11::string::_M_assign(local_160);
      pAVar3 = local_1f8.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_168 = (int)local_4c8;
      object_00 = local_1f8.
                  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_1f8.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_1f8.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_498 = (undefined1  [8])&local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"reqSigs","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
        if (local_498 != (undefined1  [8])&local_488) {
          operator_delete((void *)local_498);
        }
        local_498 = (undefined1  [8])&local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"addresses","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
        if (local_498 != (undefined1  [8])&local_488) {
          operator_delete((void *)local_498);
        }
      }
      else {
        do {
          core::Address::Address((Address *)local_498,object_00);
          core::Address::GetAddress_abi_cxx11_(&local_b0,(Address *)local_498);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_138,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_350);
          core::Script::~Script(&local_390);
          local_420._0_8_ = &PTR__TaprootScriptTree_0072eb30;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     local_3a8);
          core::TapBranch::~TapBranch((TapBranch *)local_420);
          if (local_438 != (pointer)0x0) {
            operator_delete(local_438);
          }
          if ((void *)local_450._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)local_450._M_allocated_capacity);
          }
          if (local_468 != (pointer)0x0) {
            operator_delete(local_468);
          }
          if ((char *)local_488._M_allocated_capacity != local_478) {
            operator_delete((void *)local_488._M_allocated_capacity);
          }
          object_00 = object_00 + 1;
        } while (object_00 != pAVar3);
      }
      DecodeRawTransactionTxOut::SetScriptPubKey
                ((DecodeRawTransactionTxOut *)local_320,(DecodeLockingScript *)local_1e0);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
      ::push_back(&(response->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
                   super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
                  ,(value_type *)local_320);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
      local_58._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_58.prefix_list_);
      core::Script::~Script(&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      DecodeLockingScript::~DecodeLockingScript((DecodeLockingScript *)local_1e0);
      local_320 = (undefined1  [8])&PTR__DecodeRawTransactionTxOut_0072f5b8;
      DecodeLockingScript::~DecodeLockingScript(&local_2d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_318);
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 != local_4a0);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (&local_120);
  core::Transaction::~Transaction(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TransactionJsonApi::DecodeRawTransaction(
    DecodeRawTransactionRequest* request,
    DecodeRawTransactionResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate version number
  const std::string& hex_string = request->GetHex();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to DecodeRawTransactionRequest. hex empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }
  // TODO(k-matsuzawa): iswitness未使用。bitcoincoreの指定方法が不明瞭

  NetType net_type = ConvertNetType(request->GetNetwork());

  // TransactionController作成
  Transaction tx(hex_string);

  response->SetTxid(tx.GetTxid().GetHex());
  response->SetHash(Txid(tx.GetWitnessHash()).GetHex());
  response->SetSize(tx.GetTotalSize());
  response->SetVsize(tx.GetVsize());
  response->SetWeight(tx.GetWeight());
  response->SetVersion(tx.GetVersion());
  response->SetLocktime(tx.GetLockTime());

  // TxInの追加
  for (const TxInReference& tx_in_ref : tx.GetTxInList()) {
    DecodeRawTransactionTxIn res_txin;
    if (tx.IsCoinBase()) {
      res_txin.SetIgnoreItem("txid");
      res_txin.SetIgnoreItem("vout");
      res_txin.SetIgnoreItem("scriptSig");
      res_txin.SetIgnoreItem("txinwitness");

      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.SetCoinbase(tx_in_ref.GetUnlockingScript().GetHex());
      }
    } else {
      res_txin.SetIgnoreItem("coinbase");

      res_txin.SetTxid(tx_in_ref.GetTxid().GetHex());
      res_txin.SetVout(tx_in_ref.GetVout());
      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.GetScriptSig().SetAsm(tx_in_ref.GetUnlockingScript().ToString());
        res_txin.GetScriptSig().SetHex(tx_in_ref.GetUnlockingScript().GetHex());
      }
      for (const ByteData& witness :
           tx_in_ref.GetScriptWitness().GetWitness()) {  // NOLINT
        res_txin.GetTxinwitness().push_back(witness.GetHex());
      }
      if (res_txin.GetTxinwitness().empty()) {
        // txinwitnessを除外
        res_txin.SetIgnoreItem("txinwitness");
      }
    }
    res_txin.SetSequence(tx_in_ref.GetSequence());
    response->GetVin().push_back(res_txin);
  }

  // TxOutの追加
  int32_t txout_count = 0;
  for (const TxOutReference& txout_ref : tx.GetTxOutList()) {
    DecodeRawTransactionTxOut res_txout;
    res_txout.SetValue(txout_ref.GetValue().GetSatoshiValue());
    res_txout.SetN(txout_count);

    DecodeLockingScript script_pub_key_res;
    std::vector<std::string> addresses;
    Script locking_script = txout_ref.GetLockingScript();
    script_pub_key_res.SetHex(locking_script.GetHex());
    script_pub_key_res.SetAsm(locking_script.ToString());

    AddressFactory addr_factory(net_type);
    int64_t require_num = 0;
    std::string script_type;
    auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
        addr_factory, locking_script, &script_type, &require_num);
    script_pub_key_res.SetType(script_type);
    script_pub_key_res.SetReqSigs(require_num);
    if (addr_list.empty()) {
      script_pub_key_res.SetIgnoreItem("reqSigs");
      script_pub_key_res.SetIgnoreItem("addresses");
    } else {
      for (auto addr : addr_list) {
        script_pub_key_res.GetAddresses().push_back(addr.GetAddress());
      }
    }
    res_txout.SetScriptPubKey(script_pub_key_res);

    response->GetVout().push_back(res_txout);
    ++txout_count;
  }
}